

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::InvalidMessage::InvalidMessage(InvalidMessage *this,InvalidMessage *param_1)

{
  Exception::Exception(&this->super_Exception,&param_1->super_Exception);
  *(undefined ***)&this->super_Exception = &PTR__Exception_001fd260;
  return;
}

Assistant:

InvalidMessage(const std::string &what = "")
      : Exception("Invalid message", what) {}